

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void __thiscall wasm_functype_t::wasm_functype_t(wasm_functype_t *this,FuncType *ft)

{
  ExternType *local_20;
  
  std::make_unique<wabt::interp::FuncType,wabt::interp::FuncType&>
            ((FuncType *)&stack0xffffffffffffffe0);
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = local_20;
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_00238bc8;
  FromWabtValueTypes(&ft->params,&this->params);
  FromWabtValueTypes(&ft->results,&this->results);
  return;
}

Assistant:

wasm_functype_t(FuncType ft)
      : wasm_externtype_t{std::make_unique<FuncType>(ft)} {
    FromWabtValueTypes(ft.params, &params);
    FromWabtValueTypes(ft.results, &results);
  }